

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_2::MaxSamplesCase::preDraw(MaxSamplesCase *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  TestError *this_00;
  MessageBuilder local_358;
  undefined1 local_1d2;
  allocator<char> local_1d1;
  string local_1d0;
  int local_1b0;
  int maxSampleLoc;
  MessageBuilder local_1a0;
  int local_1c;
  long lStack_18;
  deInt32 maxSamples;
  Functions *gl;
  MaxSamplesCase *this_local;
  
  gl = (Functions *)this;
  pRVar4 = Context::getRenderContext
                     ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase
                      .m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar2);
  local_1c = -1;
  (**(code **)(lStack_18 + 0x868))(0x8d57,&local_1c);
  dVar3 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar3,"query GL_MAX_SAMPLES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSampleVariableTests.cpp"
                  ,0x173);
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase
                      .super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [18])"GL_MAX_SAMPLES = ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1c);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  pcVar1 = *(code **)(lStack_18 + 0xb48);
  dVar3 = glu::ShaderProgram::getProgram
                    ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.m_program);
  local_1b0 = (*pcVar1)(dVar3,"u_maxSamples");
  if (local_1b0 == -1) {
    local_1d2 = 1;
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"Location of u_maxSamples was -1",&local_1d1);
    tcu::TestError::TestError(this_00,&local_1d0);
    local_1d2 = 0;
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lStack_18 + 0x14f0))(local_1b0,local_1c);
  dVar3 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar3,"set u_maxSamples uniform",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSampleVariableTests.cpp"
                  ,0x17f);
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase
                      .super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_358,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_358,(char (*) [20])"Set u_maxSamples = ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1c);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_358);
  return;
}

Assistant:

void MaxSamplesCase::preDraw (void)
{
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	deInt32					maxSamples	= -1;

	// query samples
	{
		gl.getIntegerv(GL_MAX_SAMPLES, &maxSamples);
		GLU_EXPECT_NO_ERROR(gl.getError(), "query GL_MAX_SAMPLES");

		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_SAMPLES = " << maxSamples << tcu::TestLog::EndMessage;
	}

	// set samples
	{
		const int maxSampleLoc = gl.getUniformLocation(m_program->getProgram(), "u_maxSamples");
		if (maxSampleLoc == -1)
			throw tcu::TestError("Location of u_maxSamples was -1");

		gl.uniform1i(maxSampleLoc, maxSamples);
		GLU_EXPECT_NO_ERROR(gl.getError(), "set u_maxSamples uniform");

		m_testCtx.getLog() << tcu::TestLog::Message << "Set u_maxSamples = " << maxSamples << tcu::TestLog::EndMessage;
	}
}